

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O2

bool __thiscall
ON_ClippingRegion::SetObjectToClipTransformation(ON_ClippingRegion *this,ON_Viewport *viewport)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  ON_Xform *pOVar4;
  ON_ClippingRegion *pOVar5;
  ON_Xform *pOVar6;
  byte bVar7;
  
  bVar7 = 0;
  bVar1 = ON_Viewport::GetXform(viewport,world_cs,clip_cs,&this->m_xform);
  if (bVar1) {
    bVar1 = ON_Viewport::GetXform(viewport,clip_cs,world_cs,&this->m_inverse_xform);
    if (bVar1) {
      return true;
    }
    lVar3 = 0x10;
    pOVar4 = &ON_Xform::ZeroTransformation;
    pOVar6 = &this->m_inverse_xform;
  }
  else {
    lVar3 = 0x10;
    pOVar4 = &ON_Xform::IdentityTransformation;
    pOVar5 = this;
    for (lVar2 = lVar3; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pOVar5->m_xform).m_xform[0][0] = pOVar4->m_xform[0][0];
      pOVar4 = (ON_Xform *)((long)pOVar4 + ((ulong)bVar7 * -2 + 1) * 8);
      pOVar5 = (ON_ClippingRegion *)((long)pOVar5 + (ulong)bVar7 * -0x10 + 8);
    }
    pOVar6 = &this->m_inverse_xform;
    pOVar4 = &ON_Xform::IdentityTransformation;
  }
  for (; lVar3 != 0; lVar3 = lVar3 + -1) {
    pOVar6->m_xform[0][0] = pOVar4->m_xform[0][0];
    pOVar4 = (ON_Xform *)((long)pOVar4 + ((ulong)bVar7 * -2 + 1) * 8);
    pOVar6 = (ON_Xform *)((long)pOVar6 + (ulong)bVar7 * -0x10 + 8);
  }
  return false;
}

Assistant:

bool ON_ClippingRegion::SetObjectToClipTransformation(
  const ON_Viewport& viewport
  )
{
  if (false == viewport.GetXform(
    ON::coordinate_system::world_cs,
    ON::coordinate_system::clip_cs,
    m_xform
    ))
  {
    m_xform = ON_Xform::IdentityTransformation;
    m_inverse_xform = ON_Xform::IdentityTransformation;
    return false;
  }

  if (false == viewport.GetXform(
    ON::coordinate_system::clip_cs,
    ON::coordinate_system::world_cs,
    m_inverse_xform
    ))
  {
    m_inverse_xform = ON_Xform::ZeroTransformation;
    return false;
  }

  return true;
}